

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

void destroy_async_data(Curl_async *async)

{
  int s;
  int iVar1;
  thread_data *hnd;
  Curl_easy *data_00;
  Curl_easy *data;
  curl_socket_t sock_rd;
  int done;
  thread_data *td;
  Curl_async *async_local;
  
  if (async->tdata != (thread_data *)0x0) {
    hnd = async->tdata;
    s = (hnd->tsd).sock_pair[0];
    data_00 = (hnd->tsd).data;
    pthread_mutex_lock((pthread_mutex_t *)(hnd->tsd).mtx);
    iVar1 = (hnd->tsd).done;
    (hnd->tsd).done = 1;
    pthread_mutex_unlock((pthread_mutex_t *)(hnd->tsd).mtx);
    if (iVar1 == 0) {
      Curl_thread_destroy(hnd->thread_hnd);
    }
    else {
      if (hnd->thread_hnd != (pthread_t *)0x0) {
        Curl_thread_join(&hnd->thread_hnd);
      }
      destroy_thread_sync_data(&hnd->tsd);
      (*Curl_cfree)(async->tdata);
    }
    Curl_multi_closed(data_00,s);
    close(s);
  }
  async->tdata = (thread_data *)0x0;
  (*Curl_cfree)(async->hostname);
  async->hostname = (char *)0x0;
  return;
}

Assistant:

static void destroy_async_data(struct Curl_async *async)
{
  if(async->tdata) {
    struct thread_data *td = async->tdata;
    int done;
#ifndef CURL_DISABLE_SOCKETPAIR
    curl_socket_t sock_rd = td->tsd.sock_pair[0];
    struct Curl_easy *data = td->tsd.data;
#endif

    /*
     * if the thread is still blocking in the resolve syscall, detach it and
     * let the thread do the cleanup...
     */
    Curl_mutex_acquire(td->tsd.mtx);
    done = td->tsd.done;
    td->tsd.done = 1;
    Curl_mutex_release(td->tsd.mtx);

    if(!done) {
      Curl_thread_destroy(td->thread_hnd);
    }
    else {
      if(td->thread_hnd != curl_thread_t_null)
        Curl_thread_join(&td->thread_hnd);

      destroy_thread_sync_data(&td->tsd);

      free(async->tdata);
    }
#ifndef CURL_DISABLE_SOCKETPAIR
    /*
     * ensure CURLMOPT_SOCKETFUNCTION fires CURL_POLL_REMOVE
     * before the FD is invalidated to avoid EBADF on EPOLL_CTL_DEL
     */
    Curl_multi_closed(data, sock_rd);
    wakeup_close(sock_rd);
#endif
  }
  async->tdata = NULL;

  free(async->hostname);
  async->hostname = NULL;
}